

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O2

uint __thiscall
cnn::ClassFactoredSoftmaxBuilder::sample(ClassFactoredSoftmaxBuilder *this,Expression *rep)

{
  Tensor *pTVar1;
  ulong uVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  reference rVar9;
  vector<float,_std::allocator<float>_> wdist;
  vector<float,_std::allocator<float>_> cdist;
  Expression wscores;
  Expression cscores;
  _Vector_base<float,_std::allocator<float>_> local_a0;
  uint local_88;
  ComputationGraph *local_80;
  uint local_78;
  _Vector_base<float,_std::allocator<float>_> local_70;
  Expression local_58;
  initializer_list<cnn::expr::Expression> local_48;
  Expression local_38;
  
  local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(this->cbias).pg;
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)&local_a0;
  local_a0._M_impl.super__Vector_impl_data._M_finish._0_4_ = (this->cbias).i.t;
  local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(this->r2c).pg;
  local_88 = (this->r2c).i.t;
  local_80 = rep->pg;
  local_78 = (rep->i).t;
  local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
            ((detail *)&local_38,(initializer_list<cnn::expr::Expression> *)&local_70);
  expr::softmax((expr *)&local_a0,&local_38);
  pTVar1 = ComputationGraph::incremental_forward(this->pcg);
  as_vector((vector<float,_std::allocator<float>_> *)&local_70,pTVar1);
  fVar8 = rand01();
  uVar5 = 0;
  uVar2 = (long)local_70._M_impl.super__Vector_impl_data._M_finish -
          (long)local_70._M_impl.super__Vector_impl_data._M_start >> 2;
  while ((uVar6 = (ulong)uVar5, uVar6 < uVar2 &&
         (fVar8 = fVar8 - *(float *)((long)&(((_Vector_impl *)
                                             local_70._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_impl_data)._M_start + uVar6 * 4),
         0.0 <= fVar8))) {
    uVar5 = uVar5 + 1;
  }
  uVar5 = uVar5 - (uVar2 == uVar6);
  rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&this->singleton_cluster,(ulong)uVar5);
  if ((*rVar9._M_p & rVar9._M_mask) == 0) {
    pEVar3 = get_rc2wbias(this,uVar5);
    pEVar4 = get_rc2w(this,uVar5);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar3->pg;
    local_a0._M_impl.super__Vector_impl_data._M_finish._0_4_ = (pEVar3->i).t;
    local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar4->pg;
    local_88 = (pEVar4->i).t;
    local_80 = rep->pg;
    local_78 = (rep->i).t;
    local_48._M_len = 3;
    local_48._M_array = (iterator)&local_a0;
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_58,&local_48);
    expr::softmax((expr *)&local_a0,&local_58);
    pTVar1 = ComputationGraph::incremental_forward(this->pcg);
    as_vector((vector<float,_std::allocator<float>_> *)&local_a0,pTVar1);
    fVar8 = rand01();
    uVar7 = 0;
    uVar2 = CONCAT44(local_a0._M_impl.super__Vector_impl_data._M_finish._4_4_,
                     (uint)local_a0._M_impl.super__Vector_impl_data._M_finish) -
            (long)local_a0._M_impl.super__Vector_impl_data._M_start >> 2;
    while ((uVar6 = (ulong)uVar7, uVar6 < uVar2 &&
           (fVar8 = fVar8 - *(float *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *
                                                )local_a0._M_impl.super__Vector_impl_data._M_start)
                                              ->
                                              super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6 * 4
                                      ), 0.0 <= fVar8))) {
      uVar7 = uVar7 + 1;
    }
    uVar2 = (ulong)(uVar7 - (uVar2 == uVar6));
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_a0);
  }
  else {
    uVar2 = 0;
  }
  uVar5 = *(uint *)(*(long *)&(this->cidx2words).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + uVar2 * 4);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
  return uVar5;
}

Assistant:

unsigned ClassFactoredSoftmaxBuilder::sample(const expr::Expression& rep) {
  // TODO assert that new_graph has been called
  Expression cscores = affine_transform({cbias, r2c, rep});
  softmax(cscores);
  auto cdist = as_vector(pcg->incremental_forward());
  unsigned c = 0;
  double p = rand01();
  for (; c < cdist.size(); ++c) {
    p -= cdist[c];
    if (p < 0.0) { break; }
  }
  if (c == cdist.size()) --c;
  unsigned w = 0;
  if (!singleton_cluster[c]) {
    Expression& cwbias = get_rc2wbias(c);
    Expression& r2cw = get_rc2w(c);
    Expression wscores = affine_transform({cwbias, r2cw, rep});
    softmax(wscores);
    auto wdist = as_vector(pcg->incremental_forward());
    p = rand01();
    for (; w < wdist.size(); ++w) {
      p -= wdist[w];
      if (p < 0.0) { break; }
    }
    if (w == wdist.size()) --w;
  }
  return cidx2words[c][w];
}